

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void anon_unknown.dwarf_126ac60::sha512::Round
               (uint64_t a,uint64_t b,uint64_t c,uint64_t *d,uint64_t e,uint64_t f,uint64_t g,
               uint64_t *h,uint64_t k,uint64_t w)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = ((e << 0x17 | e >> 0x29) ^ (e << 0x2e | e >> 0x12) ^ (e << 0x32 | e >> 0xe)) + k +
          ((f ^ g) & e ^ g) + w + *h;
  *d = *d + lVar2;
  *h = ((b | a) & c | b & a) +
       ((a << 0x19 | a >> 0x27) ^ (a << 0x1e | a >> 0x22) ^ (a << 0x24 | a >> 0x1c)) + lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Round(uint64_t a, uint64_t b, uint64_t c, uint64_t& d, uint64_t e, uint64_t f, uint64_t g, uint64_t& h, uint64_t k, uint64_t w)
{
    uint64_t t1 = h + Sigma1(e) + Ch(e, f, g) + k + w;
    uint64_t t2 = Sigma0(a) + Maj(a, b, c);
    d += t1;
    h = t1 + t2;
}